

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::Start(OutputWorker *this)

{
  bool bVar1;
  __atomic_base<int> *in_RDI;
  lock_guard<std::mutex> locker;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar2;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,(mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a));
  if (!bVar1) {
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    uVar2 = 0;
    std::__atomic_base<int>::operator=(in_RDI,0);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
               (bool)in_stack_ffffffffffffff9f);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
               (bool)in_stack_ffffffffffffff9f);
    std::make_shared<std::thread,void(logger::OutputWorker::*)(),logger::OutputWorker*>
              ((type *)Loop,(OutputWorker **)in_RDI);
    std::shared_ptr<std::thread>::operator=
              ((shared_ptr<std::thread> *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
               (shared_ptr<std::thread> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x11a986);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11a998);
  return;
}

Assistant:

void OutputWorker::Start()
{
    std::lock_guard<std::mutex> locker(StartStopLock);

    // If thread is already spinning:
    if (Thread)
        return;

#if defined(_WIN32)
    CachedIsDebuggerPresent = (::IsDebuggerPresent() != FALSE);
#endif // _WIN32

    QueuePublic.clear();
    QueuePrivate.clear();

#if !defined(LOGGER_NEVER_DROP)
    Overrun = 0;
#endif // LOGGER_NEVER_DROP
    FlushRequested = false;
    Terminated = false;
    Thread = std::make_shared<std::thread>(&OutputWorker::Loop, this);

#if defined(_WIN32)
    ThreadNativeHandle = Thread->native_handle();
#endif // _WIN32
}